

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnImport
          (BinaryReaderLogging *this,Index index,ExternalKind kind,string_view module_name,
          string_view field_name)

{
  Stream *this_00;
  Enum EVar1;
  char *pcVar2;
  size_type sVar3;
  const_pointer pcVar4;
  size_type sVar5;
  const_pointer pcVar6;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar7;
  ExternalKind kind_local;
  Index index_local;
  BinaryReaderLogging *this_local;
  string_view module_name_local;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  module_name_local.data_ = (char *)module_name.size_;
  this_local = (BinaryReaderLogging *)module_name.data_;
  WriteIndent(this);
  this_00 = this->stream_;
  pcVar2 = GetKindName(kind);
  sVar3 = string_view::length((string_view *)&this_local);
  pcVar4 = string_view::data((string_view *)&this_local);
  sVar5 = string_view::length(&field_name);
  pcVar6 = string_view::data(&field_name);
  Stream::Writef(this_00,"OnImport(index: %u, kind: %s, module: \"%.*s\", field: \"%.*s\")\n",
                 (ulong)index,pcVar2,sVar3 & 0xffffffff,pcVar4,CONCAT44(uVar7,(int)sVar5),pcVar6);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x11])
                    (this->reader_,(ulong)index,(ulong)kind,this_local,module_name_local.data_,
                     field_name.size_,field_name.data_,field_name.size_);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImport(Index index,
                                     ExternalKind kind,
                                     string_view module_name,
                                     string_view field_name) {
  LOGF("OnImport(index: %" PRIindex ", kind: %s, module: \"" PRIstringview
       "\", field: \"" PRIstringview "\")\n",
       index, GetKindName(kind), WABT_PRINTF_STRING_VIEW_ARG(module_name),
       WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return reader_->OnImport(index, kind, module_name, field_name);
}